

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.c
# Opt level: O1

interp_t * interp_init(char *file,logmath_t *logmath)

{
  int32 iVar1;
  int iVar2;
  int32 iVar3;
  interp_t *piVar4;
  FILE *__stream;
  interp_wt_s *piVar5;
  size_t sVar6;
  char *pcVar7;
  bool bVar8;
  long lVar9;
  size_t n_elem;
  ulong uVar10;
  int32 byteswap;
  char eofchk;
  float f;
  char **argval;
  char **argname;
  int32 local_60;
  undefined1 local_59;
  char *local_58;
  uint32 local_50;
  float local_4c;
  FILE *local_48;
  char **local_40;
  char **local_38;
  
  if (file == (char *)0x0) {
    __assert_fail("file != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
                  ,0x9a,"interp_t *interp_init(const char *, logmath_t *)");
  }
  piVar4 = (interp_t *)
           __ckd_calloc__(1,0x18,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
                          ,0x9c);
  piVar4->logmath = logmath;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
          ,0x58,"Reading interpolation weights: %s\n",file);
  __stream = fopen(file,"rb");
  if (__stream == (FILE *)0x0) {
    err_msg_system(ERR_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
                   ,0x5b,"fopen(%s,rb) failed\n",file);
  }
  else {
    iVar1 = bio_readhdr((FILE *)__stream,&local_38,&local_40,&local_60);
    if (iVar1 < 0) {
      pcVar7 = "bio_readhdr(%s) failed\n";
      lVar9 = 0x5f;
    }
    else {
      pcVar7 = *local_38;
      local_58 = file;
      if (pcVar7 == (char *)0x0) {
        bVar8 = true;
      }
      else {
        lVar9 = 0;
        bVar8 = false;
        local_48 = __stream;
        do {
          iVar2 = strcmp(pcVar7,"version");
          if (iVar2 == 0) {
            pcVar7 = *(char **)((long)local_40 + lVar9);
            iVar2 = strcmp(pcVar7,"1.0");
            if (iVar2 != 0) {
              err_msg(ERR_WARN,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
                      ,0x67,"Version mismatch(%s): %s, expecting %s\n",local_58,pcVar7,"1.0");
            }
          }
          else {
            iVar2 = strcmp(pcVar7,"chksum0");
            if (iVar2 == 0) {
              bVar8 = true;
            }
          }
          pcVar7 = *(char **)((long)local_38 + lVar9 + 8);
          lVar9 = lVar9 + 8;
        } while (pcVar7 != (char *)0x0);
        bVar8 = !bVar8;
        __stream = local_48;
      }
      file = local_58;
      bio_hdrarg_free(local_38,local_40);
      local_40 = (char **)0x0;
      local_38 = (char **)0x0;
      local_50 = 0;
      iVar1 = bio_fread(&piVar4->n_sen,4,1,(FILE *)__stream,local_60,&local_50);
      if (iVar1 == 1) {
        local_48 = (FILE *)CONCAT71(local_48._1_7_,bVar8);
        n_elem = (size_t)piVar4->n_sen;
        if ((long)n_elem < 1) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
                  ,0x77,"%s: arraysize= %d in header\n",local_58);
          goto LAB_001100cf;
        }
        piVar5 = (interp_wt_s *)
                 __ckd_calloc__(n_elem,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
                                ,0x7b);
        piVar4->wt = piVar5;
        if (0 < piVar4->n_sen) {
          uVar10 = 0;
          do {
            iVar1 = bio_fread(&local_4c,4,1,(FILE *)__stream,local_60,&local_50);
            if (iVar1 != 1) {
              pcVar7 = "fread(%s) (arraydata) failed\n";
              lVar9 = 0x7f;
              file = local_58;
              goto LAB_001100c8;
            }
            if ((local_4c < 0.0) || (1.0 < local_4c)) {
              err_msg(ERR_FATAL,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
                      ,0x81,"%s: interpolation weight(%d)= %e\n",local_58,uVar10 & 0xffffffff);
              goto LAB_001100cf;
            }
            iVar3 = -0x38000000;
            iVar1 = -0x38000000;
            if ((local_4c != 0.0) || (NAN(local_4c))) {
              iVar1 = logs3(piVar4->logmath,(float64)(double)local_4c);
            }
            piVar4->wt[uVar10].cd = iVar1;
            if ((local_4c != 1.0) || (NAN(local_4c))) {
              iVar3 = logs3(piVar4->logmath,(float64)(1.0 - (double)local_4c));
            }
            piVar4->wt[uVar10].ci = iVar3;
            uVar10 = uVar10 + 1;
          } while ((long)uVar10 < (long)piVar4->n_sen);
        }
        if ((char)local_48 == '\0') {
          bio_verify_chksum((FILE *)__stream,local_60,local_50);
        }
        sVar6 = fread(&local_59,1,1,__stream);
        if (sVar6 != 1) {
          fclose(__stream);
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
                  ,0x8f,"Read %d interpolation weights\n",(ulong)(uint)piVar4->n_sen);
          return piVar4;
        }
        pcVar7 = "More data than expected in %s\n";
        lVar9 = 0x8b;
        file = local_58;
      }
      else {
        pcVar7 = "fread(%s) (arraysize) failed\n";
        lVar9 = 0x75;
      }
    }
LAB_001100c8:
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
            ,lVar9,pcVar7,file);
  }
LAB_001100cf:
  exit(1);
}

Assistant:

interp_t *
interp_init(const char *file, logmath_t *logmath)
{
    interp_t *ip;

    assert(file != NULL);

    ip = (interp_t *) ckd_calloc(1, sizeof(interp_t));
    ip->logmath = logmath;

    if (interp_read(ip, file) != 1)
        E_FATAL("interp_init(%s) failed\n", file);

    return ip;
}